

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Params *params)

{
  EnumDescriptor *this_00;
  int iVar1;
  int iVar2;
  undefined1 local_58 [8];
  Alias alias;
  EnumValueDescriptor *canonical_value;
  EnumValueDescriptor *value;
  int local_24;
  Params *pPStack_20;
  int i;
  Params *params_local;
  EnumDescriptor *descriptor_local;
  EnumGenerator *this_local;
  
  this->params_ = params;
  this->descriptor_ = descriptor;
  pPStack_20 = params;
  params_local = (Params *)descriptor;
  descriptor_local = (EnumDescriptor *)this;
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::vector(&this->canonical_values_);
  std::
  vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
  ::vector(&this->aliases_);
  local_24 = 0;
  while( true ) {
    iVar2 = local_24;
    iVar1 = EnumDescriptor::value_count(this->descriptor_);
    if (iVar1 <= iVar2) break;
    canonical_value = EnumDescriptor::value(this->descriptor_,local_24);
    this_00 = this->descriptor_;
    iVar2 = EnumValueDescriptor::number(canonical_value);
    alias.canonical_value = EnumDescriptor::FindValueByNumber(this_00,iVar2);
    if (canonical_value == alias.canonical_value) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(&this->canonical_values_,&canonical_value);
    }
    else {
      local_58 = (undefined1  [8])canonical_value;
      alias.value = alias.canonical_value;
      std::
      vector<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
      ::push_back(&this->aliases_,(value_type *)local_58);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor, const Params& params)
  : params_(params), descriptor_(descriptor) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
      descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}